

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_state.cpp
# Opt level: O2

void __thiscall
duckdb::LocalSortState::SinkChunk(LocalSortState *this,DataChunk *sort,DataChunk *payload)

{
  value_type vVar1;
  value_type vVar2;
  data_ptr_t *key_locations;
  idx_t iVar3;
  idx_t prefix_len;
  SortLayout *pSVar4;
  RowLayout *layout;
  const_reference cVar5;
  pointer pRVar6;
  SelectionVector *pSVar7;
  const_reference pvVar8;
  const_reference pvVar9;
  reference pvVar10;
  const_reference pvVar11;
  type pRVar12;
  idx_t sort_col;
  ulong uVar13;
  unsafe_unique_array<UnifiedVectorFormat> blob_data;
  vector<duckdb::BufferHandle,_true> handles;
  unsafe_unique_array<UnifiedVectorFormat> input_data;
  
  key_locations = (data_ptr_t *)(this->addresses).data;
  pRVar6 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
           ::operator->(&this->radix_sorting_data);
  iVar3 = sort->count;
  pSVar7 = FlatVector::IncrementalSelectionVector();
  uVar13 = 0;
  RowDataCollection::Build(&handles,pRVar6,iVar3,key_locations,(idx_t *)0x0,pSVar7);
  while( true ) {
    if ((ulong)(((long)(sort->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(sort->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x68) <= uVar13) break;
    cVar5 = vector<bool,_true>::get<true>(&this->sort_layout->has_null,uVar13);
    pvVar8 = vector<duckdb::OrderByNullType,_true>::get<true>
                       (&this->sort_layout->order_by_null_types,uVar13);
    vVar1 = *pvVar8;
    pvVar9 = vector<duckdb::OrderType,_true>::get<true>(&this->sort_layout->order_types,uVar13);
    vVar2 = *pvVar9;
    pvVar10 = vector<duckdb::Vector,_true>::get<true>(&sort->data,uVar13);
    iVar3 = sort->count;
    pSVar7 = this->sel_ptr;
    pvVar11 = vector<unsigned_long,_true>::get<true>(&this->sort_layout->prefix_lengths,uVar13);
    prefix_len = *pvVar11;
    pvVar11 = vector<unsigned_long,_true>::get<true>(&this->sort_layout->column_sizes,uVar13);
    RowOperations::RadixScatter
              (pvVar10,iVar3,pSVar7,iVar3,key_locations,vVar2 == DESCENDING,cVar5,
               vVar1 == NULLS_FIRST,prefix_len,*pvVar11,0);
    uVar13 = uVar13 + 1;
  }
  if (this->sort_layout->all_constant == false) {
    DataChunk::DataChunk((DataChunk *)&input_data);
    iVar3 = sort->count;
    for (uVar13 = 0;
        uVar13 < (ulong)(((long)(sort->data).
                                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(sort->data).
                               super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                               _M_impl.super__Vector_impl_data._M_start) / 0x68);
        uVar13 = uVar13 + 1) {
      cVar5 = vector<bool,_true>::get<true>(&this->sort_layout->constant_size,uVar13);
      if (!cVar5) {
        pvVar10 = vector<duckdb::Vector,_true>::get<true>(&sort->data,uVar13);
        ::std::vector<duckdb::Vector,std::allocator<duckdb::Vector>>::emplace_back<duckdb::Vector&>
                  ((vector<duckdb::Vector,std::allocator<duckdb::Vector>> *)&input_data,pvVar10);
      }
    }
    pRVar6 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
             ::operator->(&this->blob_sorting_data);
    pSVar7 = FlatVector::IncrementalSelectionVector();
    RowDataCollection::Build
              ((vector<duckdb::BufferHandle,_true> *)&blob_data,pRVar6,iVar3,key_locations,
               (idx_t *)0x0,pSVar7);
    ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::_M_move_assign
              (&handles.super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>,
               (vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> *)&blob_data);
    ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector
              ((vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> *)&blob_data);
    DataChunk::ToUnifiedFormat((DataChunk *)&blob_data);
    pSVar4 = this->sort_layout;
    pRVar12 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
              ::operator*(&this->blob_sorting_heap);
    RowOperations::Scatter
              ((DataChunk *)&input_data,
               (UnifiedVectorFormat *)
               blob_data.
               super_unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::UnifiedVectorFormat,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::UnifiedVectorFormat_*,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
               .super__Head_base<0UL,_duckdb::UnifiedVectorFormat_*,_false>._M_head_impl,
               &pSVar4->blob_layout,&this->addresses,pRVar12,this->sel_ptr,iVar3);
    ::std::
    unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>::
    ~unique_ptr(&blob_data.
                 super_unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
               );
    DataChunk::~DataChunk((DataChunk *)&input_data);
  }
  pRVar6 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
           ::operator->(&this->payload_data);
  iVar3 = payload->count;
  pSVar7 = FlatVector::IncrementalSelectionVector();
  RowDataCollection::Build
            ((vector<duckdb::BufferHandle,_true> *)&input_data,pRVar6,iVar3,key_locations,
             (idx_t *)0x0,pSVar7);
  ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::_M_move_assign
            (&handles.super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>,
             (vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> *)&input_data);
  ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector
            ((vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> *)&input_data);
  DataChunk::ToUnifiedFormat((DataChunk *)&input_data);
  layout = this->payload_layout;
  pRVar12 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
            ::operator*(&this->payload_heap);
  RowOperations::Scatter
            (payload,(UnifiedVectorFormat *)
                     input_data.
                     super_unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
                     ._M_t.
                     super___uniq_ptr_impl<duckdb::UnifiedVectorFormat,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::UnifiedVectorFormat_*,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
                     .super__Head_base<0UL,_duckdb::UnifiedVectorFormat_*,_false>._M_head_impl,
             layout,&this->addresses,pRVar12,this->sel_ptr,payload->count);
  ::std::
  unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>::
  ~unique_ptr(&input_data.
               super_unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
             );
  ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector
            (&handles.super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>);
  return;
}

Assistant:

void LocalSortState::SinkChunk(DataChunk &sort, DataChunk &payload) {
	D_ASSERT(sort.size() == payload.size());
	// Build and serialize sorting data to radix sortable rows
	auto data_pointers = FlatVector::GetData<data_ptr_t>(addresses);
	auto handles = radix_sorting_data->Build(sort.size(), data_pointers, nullptr);
	for (idx_t sort_col = 0; sort_col < sort.ColumnCount(); sort_col++) {
		bool has_null = sort_layout->has_null[sort_col];
		bool nulls_first = sort_layout->order_by_null_types[sort_col] == OrderByNullType::NULLS_FIRST;
		bool desc = sort_layout->order_types[sort_col] == OrderType::DESCENDING;
		RowOperations::RadixScatter(sort.data[sort_col], sort.size(), sel_ptr, sort.size(), data_pointers, desc,
		                            has_null, nulls_first, sort_layout->prefix_lengths[sort_col],
		                            sort_layout->column_sizes[sort_col]);
	}

	// Also fully serialize blob sorting columns (to be able to break ties
	if (!sort_layout->all_constant) {
		DataChunk blob_chunk;
		blob_chunk.SetCardinality(sort.size());
		for (idx_t sort_col = 0; sort_col < sort.ColumnCount(); sort_col++) {
			if (!sort_layout->constant_size[sort_col]) {
				blob_chunk.data.emplace_back(sort.data[sort_col]);
			}
		}
		handles = blob_sorting_data->Build(blob_chunk.size(), data_pointers, nullptr);
		auto blob_data = blob_chunk.ToUnifiedFormat();
		RowOperations::Scatter(blob_chunk, blob_data.get(), sort_layout->blob_layout, addresses, *blob_sorting_heap,
		                       sel_ptr, blob_chunk.size());
		D_ASSERT(blob_sorting_heap->keep_pinned);
	}

	// Finally, serialize payload data
	handles = payload_data->Build(payload.size(), data_pointers, nullptr);
	auto input_data = payload.ToUnifiedFormat();
	RowOperations::Scatter(payload, input_data.get(), *payload_layout, addresses, *payload_heap, sel_ptr,
	                       payload.size());
	D_ASSERT(payload_heap->keep_pinned);
}